

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

void __thiscall MeCab::anon_unknown_0::LatticeImpl::set_result(LatticeImpl *this,char *result)

{
  unsigned_short uVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  char *pcVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mecab_node_t *pmVar9;
  undefined4 extraout_var_02;
  long lVar10;
  undefined4 extraout_var_04;
  long lVar11;
  char **ppcVar12;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  LatticeImpl *pLVar16;
  ulong uVar17;
  long lVar18;
  size_t sVar19;
  mecab_node_t *pmVar20;
  vector<char_*,_std::allocator<char_*>_> lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  surfaces;
  string sentence;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  features;
  char *cols [2];
  allocator local_f9;
  char **local_f8;
  iterator iStack_f0;
  char **local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  LatticeImpl *local_c0;
  char *local_b8;
  long local_b0;
  char local_a8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  mecab_node_t *local_78;
  ulong local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_48 [3];
  undefined4 extraout_var_03;
  
  local_c0 = this;
  iVar3 = (*(this->super_Lattice)._vptr_Lattice[0x16])();
  sVar4 = strlen(result);
  pcVar5 = Allocator<mecab_node_t,_mecab_path_t>::alloc
                     ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var,iVar3),
                      sVar4 + 1);
  strncpy(pcVar5,result,sVar4 + 1);
  local_f8 = (char **)0x0;
  iStack_f0._M_current = (char **)0x0;
  local_e8 = (char **)0x0;
  sVar4 = strlen(result);
  local_b8 = pcVar5;
  sVar6 = strlen(pcVar5);
  if (sVar4 == 0) {
    sVar6 = 0;
  }
  else {
    pcVar5 = pcVar5 + sVar6;
    sVar13 = 0;
    pcVar8 = local_b8;
    do {
      for (; (pcVar14 = pcVar5, pcVar8 != pcVar5 && (pcVar14 = pcVar8, *pcVar8 != '\n'));
          pcVar8 = pcVar8 + 1) {
      }
      *pcVar14 = '\0';
      if (iStack_f0._M_current == local_e8) {
        std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                  ((vector<char*,std::allocator<char*>> *)&local_f8,iStack_f0,&local_b8);
      }
      else {
        *iStack_f0._M_current = local_b8;
        iStack_f0._M_current = iStack_f0._M_current + 1;
      }
      sVar13 = sVar13 + 1;
      sVar6 = sVar13;
    } while ((pcVar14 != pcVar5) &&
            (local_b8 = pcVar14 + 1, sVar6 = sVar4, pcVar8 = local_b8, sVar13 != sVar4));
  }
  if (sVar6 != (long)iStack_f0._M_current - (long)local_f8 >> 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tagger.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x324);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"lsize == lines.size()",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
    die::~die((die *)&local_b8);
  }
  local_b8 = local_a8;
  local_b0 = 0;
  local_a8[0] = '\0';
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (iStack_f0._M_current != local_f8) {
    uVar17 = 0;
    do {
      pcVar5 = local_f8[uVar17];
      iVar3 = strcmp("EOS",pcVar5);
      if (iVar3 == 0) break;
      sVar4 = strlen(pcVar5);
      pcVar8 = pcVar5 + sVar4;
      ppcVar12 = local_48;
      lVar11 = 0;
      do {
        pcVar14 = pcVar5;
        if (lVar11 == 2) {
          lVar11 = 2;
          break;
        }
        for (; (pcVar15 = pcVar8, pcVar14 != pcVar8 && (pcVar15 = pcVar14, *pcVar14 != '\t'));
            pcVar14 = pcVar14 + 1) {
        }
        *pcVar15 = '\0';
        *ppcVar12 = pcVar5;
        ppcVar12 = ppcVar12 + 1;
        lVar11 = lVar11 + 1;
        pcVar5 = pcVar15 + 1;
      } while (pcVar15 != pcVar8);
      pcVar5 = local_48[0];
      if (lVar11 != 2) break;
      std::__cxx11::string::append((char *)&local_b8);
      std::__cxx11::string::string((string *)&local_68,pcVar5,&local_f9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 &local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      std::__cxx11::string::string((string *)&local_68,local_48[1],&local_f9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                 &local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)((long)iStack_f0._M_current - (long)local_f8 >> 3));
  }
  pLVar16 = local_c0;
  if ((long)local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
      (long)local_d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tagger.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x335);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"features.size() == surfaces.size()",0x22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
    die::~die((die *)&local_68);
  }
  iVar3 = (*(pLVar16->super_Lattice)._vptr_Lattice[0x16])(pLVar16);
  pcVar5 = local_b8;
  sVar19 = local_b0 + 1;
  pcVar8 = Allocator<mecab_node_t,_mecab_path_t>::alloc
                     ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var_00,iVar3),
                      sVar19);
  strncpy(pcVar8,pcVar5,sVar19);
  (*(pLVar16->super_Lattice)._vptr_Lattice[9])(pLVar16,pcVar8);
  iVar3 = (*(pLVar16->super_Lattice)._vptr_Lattice[0x16])(pLVar16);
  lVar18 = CONCAT44(extraout_var_01,iVar3);
  pmVar9 = FreeList<mecab_node_t>::alloc(*(FreeList<mecab_node_t> **)(lVar18 + 0x18));
  *(undefined8 *)&pmVar9->wcost = 0;
  pmVar9->cost = 0;
  pmVar9->isbest = '\0';
  *(undefined3 *)&pmVar9->field_0x51 = 0;
  pmVar9->alpha = 0.0;
  pmVar9->beta = 0.0;
  pmVar9->prob = 0.0;
  pmVar9->id = 0;
  pmVar9->length = 0;
  pmVar9->rlength = 0;
  pmVar9->rcAttr = 0;
  pmVar9->lcAttr = 0;
  pmVar9->posid = 0;
  pmVar9->char_type = '\0';
  pmVar9->stat = '\0';
  pmVar9->surface = (char *)0x0;
  pmVar9->feature = (char *)0x0;
  pmVar9->rpath = (mecab_path_t *)0x0;
  pmVar9->lpath = (mecab_path_t *)0x0;
  pmVar9->enext = (mecab_node_t *)0x0;
  pmVar9->bnext = (mecab_node_t *)0x0;
  pmVar9->prev = (mecab_node_t *)0x0;
  pmVar9->next = (mecab_node_t *)0x0;
  lVar11 = *(long *)(lVar18 + 8);
  *(long *)(lVar18 + 8) = lVar11 + 1;
  pmVar9->id = (uint)lVar11;
  pmVar9->surface = "BOS/EOS";
  pmVar9->feature = "BOS/EOS";
  pmVar9->stat = '\x02';
  pmVar9->isbest = '\x01';
  iVar3 = (*(pLVar16->super_Lattice)._vptr_Lattice[0x16])(pLVar16);
  lVar18 = CONCAT44(extraout_var_02,iVar3);
  local_78 = FreeList<mecab_node_t>::alloc(*(FreeList<mecab_node_t> **)(lVar18 + 0x18));
  *(undefined8 *)&local_78->wcost = 0;
  local_78->cost = 0;
  local_78->isbest = '\0';
  *(undefined3 *)&local_78->field_0x51 = 0;
  local_78->alpha = 0.0;
  local_78->beta = 0.0;
  local_78->prob = 0.0;
  local_78->id = 0;
  local_78->length = 0;
  local_78->rlength = 0;
  local_78->rcAttr = 0;
  local_78->lcAttr = 0;
  local_78->posid = 0;
  local_78->char_type = '\0';
  local_78->stat = '\0';
  local_78->surface = (char *)0x0;
  local_78->feature = (char *)0x0;
  local_78->rpath = (mecab_path_t *)0x0;
  local_78->lpath = (mecab_path_t *)0x0;
  local_78->enext = (mecab_node_t *)0x0;
  local_78->bnext = (mecab_node_t *)0x0;
  local_78->prev = (mecab_node_t *)0x0;
  local_78->next = (mecab_node_t *)0x0;
  lVar11 = *(long *)(lVar18 + 8);
  *(long *)(lVar18 + 8) = lVar11 + 1;
  local_78->id = (uint)lVar11;
  local_78->surface = "BOS/EOS";
  local_78->feature = "BOS/EOS";
  local_78->stat = '\x03';
  local_78->isbest = '\x01';
  pmVar9->surface = pLVar16->sentence_;
  *(pLVar16->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl
   .super__Vector_impl_data._M_start = pmVar9;
  if (local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar18 = 8;
    uVar17 = 0;
    lVar11 = 0;
    pmVar20 = pmVar9;
    do {
      local_70 = uVar17;
      iVar3 = (*(pLVar16->super_Lattice)._vptr_Lattice[0x16])(pLVar16);
      lVar10 = CONCAT44(extraout_var_03,iVar3);
      pmVar9 = FreeList<mecab_node_t>::alloc(*(FreeList<mecab_node_t> **)(lVar10 + 0x18));
      *(undefined8 *)&pmVar9->wcost = 0;
      pmVar9->cost = 0;
      pmVar9->isbest = '\0';
      *(undefined3 *)&pmVar9->field_0x51 = 0;
      pmVar9->alpha = 0.0;
      pmVar9->beta = 0.0;
      pmVar9->prob = 0.0;
      pmVar9->id = 0;
      pmVar9->length = 0;
      pmVar9->rlength = 0;
      pmVar9->rcAttr = 0;
      pmVar9->lcAttr = 0;
      pmVar9->posid = 0;
      pmVar9->char_type = '\0';
      pmVar9->stat = '\0';
      pmVar9->surface = (char *)0x0;
      pmVar9->feature = (char *)0x0;
      pmVar9->rpath = (mecab_path_t *)0x0;
      pmVar9->lpath = (mecab_path_t *)0x0;
      pmVar9->enext = (mecab_node_t *)0x0;
      pmVar9->bnext = (mecab_node_t *)0x0;
      pmVar9->prev = (mecab_node_t *)0x0;
      pmVar9->next = (mecab_node_t *)0x0;
      lVar2 = *(long *)(lVar10 + 8);
      *(long *)(lVar10 + 8) = lVar2 + 1;
      pmVar9->id = (uint)lVar2;
      pmVar9->prev = pmVar20;
      pmVar20->next = pmVar9;
      pmVar9->surface = local_c0->sentence_ + lVar11;
      uVar1 = *(unsigned_short *)
               ((long)&((local_d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar18);
      pmVar9->length = uVar1;
      pmVar9->rlength = uVar1;
      pmVar9->stat = '\0';
      pmVar9->isbest = '\x01';
      pmVar9->wcost = 0;
      pmVar9->cost = 0;
      iVar3 = (*(local_c0->super_Lattice)._vptr_Lattice[0x16])();
      pcVar5 = *(char **)((long)local_98.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar18 + -8);
      sVar19 = *(long *)((long)&((local_98.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar18) + 1;
      pcVar8 = Allocator<mecab_node_t,_mecab_path_t>::alloc
                         ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var_04,iVar3),
                          sVar19);
      strncpy(pcVar8,pcVar5,sVar19);
      pmVar9->feature = pcVar8;
      (local_c0->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar11] = pmVar9;
      lVar11 = lVar11 + (ulong)pmVar9->length;
      (local_c0->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar11] = pmVar9;
      uVar17 = local_70 + 1;
      lVar18 = lVar18 + 0x20;
      pLVar16 = local_c0;
      pmVar20 = pmVar9;
    } while (uVar17 < (ulong)((long)local_d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pmVar9->next = local_78;
  local_78->prev = pmVar9;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if (local_f8 != (char **)0x0) {
    operator_delete(local_f8);
  }
  return;
}

Assistant:

void LatticeImpl::set_result(const char *result) {
  char *str = allocator()->strdup(result, std::strlen(result));
  std::vector<char *> lines;
  const size_t lsize = tokenize(str, "\n",
                                std::back_inserter(lines),
                                std::strlen(result));
  CHECK_DIE(lsize == lines.size());

  std::string sentence;
  std::vector<std::string> surfaces, features;
  for (size_t i = 0; i < lines.size(); ++i) {
    if (::strcmp("EOS", lines[i]) == 0) {
      break;
    }
    char *cols[2];
    if (tokenize(lines[i], "\t", cols, 2) != 2) {
      break;
    }
    sentence += cols[0];
    surfaces.push_back(cols[0]);
    features.push_back(cols[1]);
  }

  CHECK_DIE(features.size() == surfaces.size());

  set_sentence(allocator()->strdup(sentence.c_str(), sentence.size()));

  Node *bos_node = allocator()->newNode();
  bos_node->surface = const_cast<const char *>(BOS_KEY);  // dummy
  bos_node->feature = "BOS/EOS";
  bos_node->isbest = 1;
  bos_node->stat = MECAB_BOS_NODE;

  Node *eos_node = allocator()->newNode();
  eos_node->surface = const_cast<const char *>(BOS_KEY);  // dummy
  eos_node->feature = "BOS/EOS";
  eos_node->isbest = 1;
  eos_node->stat = MECAB_EOS_NODE;

  bos_node->surface = sentence_;
  end_nodes_[0] = bos_node;

  size_t offset = 0;
  Node *prev = bos_node;
  for (size_t i = 0; i < surfaces.size(); ++i) {
    Node *node = allocator()->newNode();
    node->prev = prev;
    prev->next = node;
    node->surface = sentence_ + offset;
    node->length = surfaces[i].size();
    node->rlength = surfaces[i].size();
    node->isbest = 1;
    node->stat = MECAB_NOR_NODE;
    node->wcost = 0;
    node->cost = 0;
    node->feature = allocator()->strdup(features[i].c_str(),
                                        features[i].size());
    begin_nodes_[offset] = node;
    end_nodes_[offset + node->length] = node;
    offset += node->length;
    prev = node;
  }

  prev->next = eos_node;
  eos_node->prev = prev;
}